

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ExtensionDeclarationsDuplicateNames_Test
::ValidationErrorTest_ExtensionDeclarationsDuplicateNames_Test
          (ValidationErrorTest_ExtensionDeclarationsDuplicateNames_Test *this)

{
  ValidationErrorTest_ExtensionDeclarationsDuplicateNames_Test *this_local;
  
  ValidationErrorTest::ValidationErrorTest(&this->super_ValidationErrorTest);
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_ExtensionDeclarationsDuplicateNames_Test_029aec88;
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ExtensionDeclarationsDuplicateNames) {
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          extension_range {
            start: 11
            end: 1000
            options: {
              declaration: {
                number: 123
                full_name: ".foo.Bar.baz",
                type: ".Bar"
              }
              declaration: {
                number: 999
                full_name: ".foo.Bar.baz",
                type: "int32"
              }
            }
          }
        }
      )pb",
      "foo.proto: .foo.Bar.baz: NAME: Extension field name \".foo.Bar.baz\" is "
      "declared multiple times.\n");
}